

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O3

int write_iff(lyout *out,lys_module *module,lys_iffeature *expr,int module_name_or_prefix,
             int *index_e,int *index_f)

{
  bool bVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  lys_module *plVar8;
  lys_module *plVar9;
  char *pcVar10;
  int local_34;
  
  local_34 = 0;
  while( true ) {
    iVar4 = *index_e;
    uVar2 = iff_getop(expr->expr,iVar4);
    iVar5 = *index_e;
    *index_e = iVar5 + 1;
    if (uVar2 != '\0') break;
    iVar4 = ly_print(out,"not ");
    local_34 = local_34 + iVar4;
  }
  if (uVar2 == '\x01') {
    bVar1 = true;
    pcVar10 = "and";
    if (iVar5 < 1 || iVar4 == 0) {
      iVar4 = 0;
    }
    else {
      uVar3 = iff_getop(expr->expr,iVar5 + -1);
      iVar4 = 0;
      if (uVar3 == '\0') goto LAB_001646f5;
    }
  }
  else {
    if (uVar2 != '\x02') {
      if (uVar2 == '\x03') {
        plVar8 = lys_main_module(expr->features[*index_f]->module);
        plVar9 = lys_main_module(module);
        if (plVar8 == plVar9) {
          iVar4 = 0;
        }
        else {
          plVar8 = lys_main_module(expr->features[*index_f]->module);
          pcVar10 = plVar8->name;
          if (module_name_or_prefix == 0) {
            pcVar10 = transform_module_name2import_prefix(module,pcVar10);
          }
          iVar4 = ly_print(out,"%s:",pcVar10);
        }
        iVar7 = ly_print(out,expr->features[*index_f]->name);
        iVar7 = iVar7 + iVar4;
        *index_f = *index_f + 1;
      }
      else {
        iVar7 = 0;
      }
      goto LAB_001647d6;
    }
    if (iVar4 == 0) {
      iVar4 = 0;
      bVar1 = true;
      pcVar10 = "or";
    }
    else {
LAB_001646f5:
      bVar1 = false;
      iVar4 = ly_print(out,"(");
      pcVar10 = "and";
      if (uVar2 == '\x02') {
        pcVar10 = "or";
      }
    }
  }
  iVar5 = write_iff(out,module,expr,module_name_or_prefix,index_e,index_f);
  iVar6 = ly_print(out," %s ",pcVar10);
  iVar7 = write_iff(out,module,expr,module_name_or_prefix,index_e,index_f);
  iVar7 = iVar7 + iVar6 + iVar5 + iVar4;
  if (!bVar1) {
    iVar4 = ly_print(out,")");
    iVar7 = iVar7 + iVar4;
  }
LAB_001647d6:
  return iVar7 + local_34;
}

Assistant:

static int
write_iff(struct lyout *out, const struct lys_module *module, struct lys_iffeature *expr, int module_name_or_prefix,
          int *index_e, int *index_f)
{
    int count = 0, brackets_flag = *index_e;
    uint8_t op;

    op = iff_getop(expr->expr, *index_e);
    (*index_e)++;

    switch (op) {
    case LYS_IFF_F:
        if (lys_main_module(expr->features[*index_f]->module) != lys_main_module(module)) {
            if (module_name_or_prefix) {
                count += ly_print(out, "%s:", lys_main_module(expr->features[*index_f]->module)->name);
            } else {
                count += ly_print(out, "%s:", transform_module_name2import_prefix(module, lys_main_module(expr->features[*index_f]->module)->name));
            }
        }
        count += ly_print(out, expr->features[*index_f]->name);
        (*index_f)++;
        break;
    case LYS_IFF_NOT:
        count += ly_print(out, "not ");
        count += write_iff(out, module, expr, module_name_or_prefix, index_e, index_f);
        break;
    case LYS_IFF_AND:
        if (brackets_flag) {
            /* AND need brackets only if previous op was not */
            if (*index_e < 2 || iff_getop(expr->expr, *index_e - 2) != LYS_IFF_NOT) {
                brackets_flag = 0;
            }
        }
        /* no break */
    case LYS_IFF_OR:
        if (brackets_flag) {
            count += ly_print(out, "(");
        }
        count += write_iff(out, module, expr, module_name_or_prefix, index_e, index_f);
        count += ly_print(out, " %s ", op == LYS_IFF_OR ? "or" : "and");
        count += write_iff(out, module, expr, module_name_or_prefix, index_e, index_f);
        if (brackets_flag) {
            count += ly_print(out, ")");
        }
    }

    return count;
}